

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsPrepare(Wlc_Prs_t *p)

{
  Vec_Int_t *p_00;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  if (p->vLines->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vLines) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                  ,0x129,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
  }
  pcVar5 = p->pBuffer;
  pcVar6 = pcVar5;
  do {
    if (*pcVar6 == '\n') {
      Vec_IntPush(p->vLines,(int)pcVar5 - *(int *)&p->pBuffer);
    }
    else if (*pcVar6 == '\0') {
      iVar4 = Wlc_PrsRemoveComments(p);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        if (p->vStarts->nSize != 0) {
          __assert_fail("Vec_IntSize(p->vStarts) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                        ,0x131,"int Wlc_PrsPrepare(Wlc_Prs_t *)");
        }
        pcVar5 = p->pBuffer;
        iVar4 = 1;
        pcVar6 = pcVar5;
        bVar2 = true;
        while( true ) {
          bVar1 = bVar2;
          pcVar7 = pcVar6 + 1;
          cVar3 = *pcVar6;
          if (cVar3 == '\0') break;
          if (!(bool)(~bVar1 & 1U | cVar3 != ';')) {
            *pcVar6 = '\0';
            p_00 = p->vStarts;
            pcVar5 = Wlc_PrsSkipSpaces(pcVar5);
            Vec_IntPush(p_00,(int)pcVar5 - *(int *)&p->pBuffer);
            cVar3 = *pcVar6;
            pcVar5 = pcVar7;
          }
          bVar8 = cVar3 != '\\';
          bVar2 = cVar3 == ' ';
          if (!bVar8) {
            bVar2 = bVar8;
          }
          pcVar6 = pcVar7;
          if (bVar1) {
            bVar2 = bVar8;
          }
        }
      }
      return iVar4;
    }
    pcVar6 = pcVar6 + 1;
    pcVar5 = (char *)(ulong)((int)pcVar5 + 1);
  } while( true );
}

Assistant:

int Wlc_PrsPrepare( Wlc_Prs_t * p )
{
    int fPrettyPrint = 0;
    int fNotName = 1;
    char * pTemp, * pPrev, * pThis;
    // collect info about lines
    assert( Vec_IntSize(p->vLines) == 0 );
    for ( pTemp = p->pBuffer; *pTemp; pTemp++ )
        if ( *pTemp == '\n' )
            Vec_IntPush( p->vLines, pTemp - p->pBuffer );
    // delete comments and insert breaks
    if ( !Wlc_PrsRemoveComments( p ) )
        return 0;
    // collect info about breaks
    assert( Vec_IntSize(p->vStarts) == 0 );
    for ( pPrev = pThis = p->pBuffer; *pThis; pThis++ )
    {
        if ( fNotName && *pThis == ';' )
        {
            *pThis = 0;
            Vec_IntPush( p->vStarts, Wlc_PrsOffset(p, Wlc_PrsSkipSpaces(pPrev)) );
            pPrev = pThis + 1;
        }
        if ( *pThis == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pThis == ' ' )
            fNotName = 1;
    }

    if ( fPrettyPrint )
    {
        int i, k;
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            if ( Wlc_PrsStrCmp( pTemp, "module" ) )
                printf( "\n" );
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) && !Wlc_PrsStrCmp( pTemp, "endmodule" ) )
                printf( "    " );
            printf( "%c", pTemp[0] );
            for ( k = 1; pTemp[k]; k++ )
                if ( pTemp[k] != ' ' || pTemp[k-1] != ' ' )
                    printf( "%c", pTemp[k] );
            printf( ";\n" );
        }
/*    
        // print the line types
        Wlc_PrsForEachLine( p, pTemp, i )
        {
            int k;  
            if ( !Wlc_PrsStrCmp( pTemp, "module" ) )
                continue;
            printf( "%3d : ", i );
            for ( k = 0; k < 40; k++ )
                printf( "%c", pTemp[k] ? pTemp[k] : ' ' );
            printf( "\n" );
        }
*/
    }
    return 1;
}